

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  size_t sVar1;
  ptls_buffer_t *in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  int ret;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  void *src;
  ptls_buffer_t *in_stack_ffffffffffffffb8;
  ptls_buffer_t *buf_00;
  size_t sVar2;
  long local_30;
  int local_20;
  
  local_20 = ptls_buffer__do_pushv
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  if (local_20 == 0) {
    local_30 = 2;
    src = (void *)0x2;
    buf_00 = in_RDI;
    local_20 = ptls_buffer__do_pushv(in_RDI,(void *)0x2,in_stack_ffffffffffffffa8);
    if (local_20 == 0) {
      sVar2 = in_RDI->off;
      local_20 = ptls_buffer__do_pushv(buf_00,src,in_stack_ffffffffffffffa8);
      if (local_20 == 0) {
        sVar1 = in_RDI->off;
        for (; local_30 != 0; local_30 = local_30 + -1) {
          in_RDI->base[sVar2 - local_30] =
               (uint8_t)(sVar1 - sVar2 >> (((char)local_30 + -1) * '\b' & 0x3fU));
        }
        local_20 = 0;
      }
    }
  }
  return local_20;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}